

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_optNotEmptyNullopt_Test::optCompare_optNotEmptyNullopt_Test
          (optCompare_optNotEmptyNullopt_Test *this)

{
  optCompare_optNotEmptyNullopt_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__optCompare_optNotEmptyNullopt_Test_0025c4d0;
  return;
}

Assistant:

TEST(optCompare, optNotEmptyNullopt)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_FALSE(i == nullopt);
  EXPECT_TRUE(i != nullopt);
  EXPECT_FALSE(i < nullopt);
  EXPECT_TRUE(i > nullopt);
  EXPECT_FALSE(i <= nullopt);
  EXPECT_TRUE(i >= nullopt);
}